

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O2

void __thiscall helics::apps::Source::Source(Source *this,string_view name,string *configString)

{
  _Rb_tree_header *p_Var1;
  
  App::App(&this->super_App,name,configString);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Source_004bd7d8;
  CLI::std::_Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::
  _Deque_base(&(this->sources).
               super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
             );
  (this->generators).
  super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->generators).
  super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->generators).
  super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->generatorLookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->generatorLookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->generatorLookup)._M_t._M_impl.super__Rb_tree_header;
  (this->generatorLookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->generatorLookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->pubids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->pubids)._M_t._M_impl.super__Rb_tree_header;
  (this->pubids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->generatorLookup)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->endpoints).super__Vector_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endpoints).super__Vector_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endpoints).super__Vector_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pubids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pubids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pubids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->defaultPeriod).internalTimeCode = 1000000000;
  processArgs(this);
  initialSetup(this);
  return;
}

Assistant:

Source::Source(std::string_view name, const std::string& configString): App(name, configString)
    {
        processArgs();
        initialSetup();
    }